

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS ref_mpi_sum(REF_MPI ref_mpi,void *input,void *output,REF_INT n,REF_TYPE type)

{
  ulong uVar1;
  
  if (type == 1) {
    if (0 < n) {
      uVar1 = 0;
      do {
        *(undefined4 *)((long)output + uVar1 * 4) = *(undefined4 *)((long)input + uVar1 * 4);
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
      return 0;
    }
  }
  else if (type == 2) {
    if (0 < n) {
      uVar1 = 0;
      do {
        *(undefined8 *)((long)output + uVar1 * 8) = *(undefined8 *)((long)input + uVar1 * 8);
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
      return 0;
    }
  }
  else {
    if (type != 3) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x33e,
             "ref_mpi_sum",6,"data type");
      return 6;
    }
    if (0 < n) {
      uVar1 = 0;
      do {
        *(undefined8 *)((long)output + uVar1 * 8) = *(undefined8 *)((long)input + uVar1 * 8);
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
      return 0;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_sum(REF_MPI ref_mpi, void *input, void *output,
                               REF_INT n, REF_TYPE type) {
  REF_INT i;
#ifdef HAVE_MPI
  MPI_Datatype datatype;

  if (!ref_mpi_para(ref_mpi)) {
    switch (type) {
      case REF_INT_TYPE:
        for (i = 0; i < n; i++) ((REF_INT *)output)[i] = ((REF_INT *)input)[i];
        break;
      case REF_LONG_TYPE:
        for (i = 0; i < n; i++)
          ((REF_LONG *)output)[i] = ((REF_LONG *)input)[i];
        break;
      case REF_DBL_TYPE:
        for (i = 0; i < n; i++) ((REF_DBL *)output)[i] = ((REF_DBL *)input)[i];
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
  } else {
    ref_type_mpi_type(type, datatype);
    ref_mpi_where_am_i(ref_mpi);
    MPI_Reduce(input, output, n, datatype, MPI_SUM, 0, ref_mpi_comm(ref_mpi));
  }

#else
  switch (type) {
    case REF_INT_TYPE:
      for (i = 0; i < n; i++) ((REF_INT *)output)[i] = ((REF_INT *)input)[i];
      break;
    case REF_LONG_TYPE:
      for (i = 0; i < n; i++) ((REF_LONG *)output)[i] = ((REF_LONG *)input)[i];
      break;
    case REF_DBL_TYPE:
      for (i = 0; i < n; i++) ((REF_DBL *)output)[i] = ((REF_DBL *)input)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
#endif

  return REF_SUCCESS;
}